

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgParticleSwarm.hpp
# Opt level: O3

void __thiscall
TasOptimization::ParticleSwarmState::setParticlePositions
          (ParticleSwarmState *this,vector<double,_std::allocator<double>_> *pp)

{
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"ParticleSwarmState::setParticlePositions","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"particle position","");
  checkVarSize(&local_40,&local_60,
               (int)((ulong)((long)(pp->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                   .super__Vector_impl_data._M_finish -
                            (long)(pp->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start) >> 3),
               this->num_particles * this->num_dimensions);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::vector<double,_std::allocator<double>_>::operator=(&this->particle_positions,pp);
  this->positions_initialized = true;
  return;
}

Assistant:

void setParticlePositions(const std::vector<double> &pp) {
        checkVarSize("ParticleSwarmState::setParticlePositions", "particle position", pp.size(), num_dimensions * num_particles);
        particle_positions = pp;
        positions_initialized = true;
    }